

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O2

int XMLSearch_init_from_XPath(SXML_CHAR *xpath,XMLSearch *search)

{
  char *pcVar1;
  char cVar2;
  SXML_CHAR SVar3;
  int iVar4;
  uint uVar5;
  char *__ptr;
  SXML_CHAR *attr_value;
  char cVar6;
  SXML_CHAR SVar7;
  XMLSearch *pXVar8;
  SXML_CHAR *pSVar9;
  char *tag;
  XMLSearch *search_00;
  SXML_CHAR *pSVar10;
  SXML_CHAR *pSVar11;
  char *pcVar12;
  int local_68;
  SXML_CHAR local_61;
  int r0;
  int l1;
  int is;
  int l0;
  XMLSearch *local_50;
  char *local_48;
  XMLSearch *local_40;
  XMLSearch *local_38;
  
  if (search == (XMLSearch *)0x0) {
    return 0;
  }
  search->n_attributes = 0;
  search->tag = (SXML_CHAR *)0x0;
  search->attributes = (XMLAttribute *)0x0;
  search->prev = (_XMLSearch *)0x0;
  search->text = (SXML_CHAR *)0x0;
  search->next = (_XMLSearch *)0x0;
  search->stop_at = (XMLNode *)0xffffffffffffffff;
  search->init_value = 0x19770522;
  if ((xpath != (SXML_CHAR *)0x0) && (*xpath != '\0')) {
    __ptr = strdup(xpath);
    pXVar8 = (XMLSearch *)0x0;
    search_00 = search;
    tag = __ptr;
    while (cVar6 = *tag, cVar6 != '\0') {
      if ((search != search_00) &&
         (search = (XMLSearch *)calloc(1,0x40), search == (XMLSearch *)0x0)) {
        free(__ptr);
LAB_00106aca:
        XMLSearch_free(search_00,1);
        return 0;
      }
      while (cVar6 == '/') {
        pcVar12 = tag + 1;
        tag = tag + 1;
        cVar6 = *pcVar12;
      }
      pSVar10 = tag;
      if (cVar6 == '\0') {
        free(__ptr);
        return 0;
      }
      do {
        while (cVar6 = pSVar10[1], cVar6 != '\\') {
          pcVar12 = pSVar10 + 1;
          if ((cVar6 == '\0') || (pSVar10 = pcVar12, cVar6 == '/')) goto LAB_00106871;
        }
        pcVar12 = pSVar10 + 2;
        pcVar1 = pSVar10 + 2;
        pSVar10 = pcVar12;
      } while (*pcVar1 != '\0');
      cVar6 = '\0';
LAB_00106871:
      *pcVar12 = '\0';
      pSVar10 = tag;
      if (search != (XMLSearch *)0x0) {
        search->tag = (SXML_CHAR *)0x0;
        search->attributes = (XMLAttribute *)0x0;
        search->n_attributes = 0;
        search->text = (SXML_CHAR *)0x0;
        search->next = (_XMLSearch *)0x0;
        search->prev = (_XMLSearch *)0x0;
        search->stop_at = (XMLNode *)0xffffffffffffffff;
        search->init_value = 0x19770522;
      }
      for (; (cVar2 = *pSVar10, cVar2 != '\0' && (cVar2 != '[')); pSVar10 = pSVar10 + 1) {
      }
      *pSVar10 = '\0';
      local_50 = search;
      local_48 = __ptr;
      local_40 = search_00;
      local_38 = pXVar8;
      iVar4 = XMLSearch_search_set_tag(search,tag);
      *pSVar10 = cVar2;
      if (iVar4 == 0) {
LAB_00106ab8:
        free(local_48);
        search_00 = local_40;
        goto LAB_00106aca;
      }
      if (cVar2 != '\0') {
        while ((cVar2 = pSVar10[1], cVar2 != '\0' && (cVar2 != ']'))) {
          pSVar9 = pSVar10 + 1;
          pSVar11 = pSVar10 + 2;
          SVar7 = cVar2;
          while (SVar7 != '\0') {
            if ((SVar7 == ',') || (SVar7 == ']')) {
              pSVar11[-1] = '\0';
              cVar2 = *pSVar9;
              break;
            }
            SVar7 = *pSVar11;
            pSVar11 = pSVar11 + 1;
          }
          if (cVar2 == '@') {
            pSVar9 = pSVar10 + 2;
            iVar4 = split_left_right(pSVar9,'=',&l0,&l1,&is,&r0,&local_68,1,1);
            if (iVar4 == 0) goto LAB_00106ab8;
            SVar3 = pSVar10[(long)l1 + 3];
            local_61 = pSVar10[(long)local_68 + 3];
            pSVar10[(long)l1 + 3] = '\0';
            pSVar10[(long)local_68 + 3] = '\0';
            attr_value = (SXML_CHAR *)0x0;
            if (-1 < is) {
              attr_value = pSVar9 + r0;
            }
            uVar5 = XMLSearch_search_add_attribute(local_50,pSVar9 + l0,attr_value,1);
            uVar5 = ~uVar5 >> 0x1f;
            pSVar10[(long)l1 + 3] = SVar3;
            pSVar10[(long)local_68 + 3] = local_61;
            pSVar10 = pSVar9 + (long)local_68 + -1;
          }
          else if (cVar2 == '.') {
            iVar4 = split_left_right(pSVar9,'=',&l0,&l1,&is,&r0,&local_68,1,1);
            if (iVar4 == 0) goto LAB_00106ab8;
            SVar3 = pSVar10[(long)local_68 + 2];
            pSVar10[(long)local_68 + 2] = '\0';
            uVar5 = XMLSearch_search_set_text(local_50,pSVar9 + r0);
            pSVar10[(long)local_68 + 2] = SVar3;
            pSVar10 = pSVar9 + (long)local_68 + 1;
          }
          else {
            uVar5 = 1;
            pSVar10 = pSVar9;
          }
          pSVar11[-1] = SVar7;
          if (uVar5 == 0) goto LAB_00106ab8;
        }
      }
      *pcVar12 = cVar6;
      if (local_38 != (XMLSearch *)0x0) {
        local_38->next = local_50;
      }
      search = (XMLSearch *)0x0;
      pXVar8 = local_50;
      search_00 = local_40;
      __ptr = local_48;
      tag = pcVar12;
      if (local_50 != local_40) {
        local_50->prev = local_38;
        search = (XMLSearch *)0x0;
      }
    }
    free(__ptr);
  }
  return 1;
}

Assistant:

int XMLSearch_init_from_XPath(const SXML_CHAR* xpath, XMLSearch* search)
{
	XMLSearch *search1, *search2;
	SXML_CHAR *p, *tag, *tag0;
	SXML_CHAR c;

	if (!XMLSearch_init(search))
		return FALSE;

	/* NULL or empty xpath is an empty (initialized only) search */
	if (xpath == NULL || *xpath == NULC)
		return TRUE;

	search1 = NULL;		/* Search struct to add the xpath portion to */
	search2 = search;	/* Search struct to be filled from xpath portion */

	tag = tag0 = sx_strdup(xpath); /* Create a copy of 'xpath' to be able to patch it (or segfault if 'xpath' is const, cnacu6o Sergey@sourceforge!) */
	while (*tag != NULC) {
		if (search2 != search) { /* Allocate a new search when the original one (i.e. 'search') has already been filled */
			search2 = (XMLSearch*)__calloc(1, sizeof(XMLSearch));
			if (search2 == NULL) {
				__free(tag0);
				(void)XMLSearch_free(search, TRUE);
				return FALSE;
			}
		}
		/* Skip all first '/' */
		for (; *tag != NULC && *tag == C2SX('/'); tag++) ;
		if (*tag == NULC) {
			__free(tag0);
			return FALSE;
		}

		/* Look for the end of tag name: after '/' (to get another tag) or end of string */
		for (p = &tag[1]; *p != NULC && *p != C2SX('/'); p++) {
			if (*p == C2SX('\\') && *++p == NULC)
				break; /* Escape character, '\' could be the last character... */
		}
		c = *p; /* Backup character before nulling it */
		*p = NULC;
		if (!_init_search_from_1XPath(tag, search2)) {
			__free(tag0);
			(void)XMLSearch_free(search, TRUE);
			return FALSE;
		}
		*p = c;

		/* 'search2' is the newly parsed tag, 'search1' is the previous tag (or NULL if 'search2' is the first tag to parse (i.e. 'search2' == 'search') */

		if (search1 != NULL) search1->next = search2;
		if (search2 != search) search2->prev = search1;
		search1 = search2;
		search2 = NULL; /* Will force allocation during next loop */
		tag = p;
	}

	__free(tag0);
	return TRUE;
}